

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::clearRubberBand(QGraphicsViewPrivate *this)

{
  QPointF _t3;
  QPointF _t2;
  bool bVar1;
  QWidget *widget;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *q;
  QGraphicsViewPrivate *in_stack_ffffffffffffff90;
  QWidget *pQVar2;
  QGraphicsViewPrivate *this_00;
  QRect in_stack_ffffffffffffffb0;
  QPointF local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  widget = (QWidget *)q_func(in_RDI);
  if (((in_RDI->dragMode == RubberBandDrag) && ((*(uint *)&in_RDI->field_0x300 & 1) != 0)) &&
     ((in_RDI->rubberBanding & 1U) != 0)) {
    if (in_RDI->viewportUpdateMode != NoViewportUpdate) {
      if (in_RDI->viewportUpdateMode == FullViewportUpdate) {
        updateAll(in_stack_ffffffffffffff90);
      }
      else {
        in_stack_ffffffffffffff90 =
             (QGraphicsViewPrivate *)
             QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff90);
        QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff90);
        rubberBandRegion(this_00,widget,(QRect *)in_RDI);
        QWidget::update(widget,(QRegion *)in_RDI);
        QRegion::~QRegion(&local_10);
      }
    }
    in_RDI->rubberBanding = false;
    in_RDI->rubberBandSelectionOperation = ReplaceSelection;
    bVar1 = QRect::isNull((QRect *)in_stack_ffffffffffffff90);
    if (!bVar1) {
      QRect::QRect((QRect *)in_stack_ffffffffffffff90);
      (in_RDI->rubberBandRect).x1 = (Representation)(undefined4)local_20;
      (in_RDI->rubberBandRect).y1 = (Representation)local_20._4_4_;
      (in_RDI->rubberBandRect).x2 = (Representation)(undefined4)local_18;
      (in_RDI->rubberBandRect).y2 = (Representation)local_18._4_4_;
      local_30._0_4_ = (in_RDI->rubberBandRect).x1;
      local_30._4_4_ = (in_RDI->rubberBandRect).y1;
      local_28._0_4_ = (in_RDI->rubberBandRect).x2;
      local_28._4_4_ = (in_RDI->rubberBandRect).y2;
      pQVar2 = widget;
      QPointF::QPointF(&local_40);
      QPointF::QPointF((QPointF *)&stack0xffffffffffffffb0);
      _t2.yp = (qreal)this_00;
      _t2.xp = (qreal)pQVar2;
      _t3.yp = (qreal)in_RDI;
      _t3.xp = (qreal)in_stack_ffffffffffffff90;
      QGraphicsView::rubberBandChanged((QGraphicsView *)widget,in_stack_ffffffffffffffb0,_t2,_t3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsViewPrivate::clearRubberBand()
{
    Q_Q(QGraphicsView);
    if (dragMode != QGraphicsView::RubberBandDrag || !sceneInteractionAllowed || !rubberBanding)
        return;

    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }

    rubberBanding = false;
    rubberBandSelectionOperation = Qt::ReplaceSelection;
    if (!rubberBandRect.isNull()) {
        rubberBandRect = QRect();
        emit q->rubberBandChanged(rubberBandRect, QPointF(), QPointF());
    }
}